

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AllReader::loop(AllReader *this,uint64_t limit)

{
  long lVar1;
  undefined8 *puVar2;
  PromiseArena *pPVar3;
  OwnPromiseNode OVar4;
  uchar *puVar5;
  PromiseArena *pPVar6;
  void *pvVar7;
  _func_int **in_RDX;
  size_t sVar8;
  TransformPromiseNodeBase *this_00;
  _func_int **elementCount;
  OwnPromiseNode local_a0;
  Array<unsigned_char> part;
  uint64_t limit_local;
  OwnPromiseNode intermediate;
  DebugComparison<unsigned_long_&,_int> _kjCondition;
  AsyncInputStream *local_38;
  
  _kjCondition.left = &limit_local;
  _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
  _kjCondition.op.content.ptr = " > ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = in_RDX != (_func_int **)0x0;
  if (_kjCondition.result) {
    elementCount = (_func_int **)0x1000;
    if (in_RDX < (_func_int **)0x1000) {
      elementCount = in_RDX;
    }
    limit_local = (uint64_t)in_RDX;
    pPVar6 = (PromiseArena *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (1,(size_t)elementCount,(size_t)elementCount,(_func_void_void_ptr *)0x0,
                        (_func_void_void_ptr *)0x0);
    part.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    lVar1 = *(long *)(limit + 0x18);
    part.ptr = (uchar *)pPVar6;
    part.size_ = (size_t)elementCount;
    if (*(long *)(limit + 0x10) == lVar1) {
      sVar8 = 4;
      if (lVar1 != *(long *)(limit + 8)) {
        sVar8 = (lVar1 - *(long *)(limit + 8) >> 3) * 0x5555555555555556;
      }
      Vector<kj::Array<unsigned_char>_>::setCapacity
                ((Vector<kj::Array<unsigned_char>_> *)(limit + 8),sVar8);
    }
    puVar2 = *(undefined8 **)(limit + 0x10);
    *puVar2 = part.ptr;
    puVar2[1] = part.size_;
    puVar2[2] = part.disposer;
    part.ptr = (uchar *)0x0;
    part.size_ = 0;
    *(undefined8 **)(limit + 0x10) = puVar2 + 3;
    (**(code **)(**(long **)limit + 8))(&local_a0,*(long **)limit,pPVar6,elementCount,elementCount);
    OVar4.ptr = local_a0.ptr;
    pPVar3 = ((local_a0.ptr)->super_PromiseArenaMember).arena;
    if (pPVar3 == (PromiseArena *)0x0 || (ulong)((long)local_a0.ptr - (long)pPVar3) < 0x40) {
      pvVar7 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar7 + 0x3c0);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_a0,
                 kj::_::
                 SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:188:15)>
                 ::anon_class_32_3_f55ac5fb_for_func::operator());
      *(undefined ***)((long)pvVar7 + 0x3c0) = &PTR_destroy_0070a240;
      *(uint64_t *)((long)pvVar7 + 0x3e0) = limit;
      *(PromiseArena **)((long)pvVar7 + 1000) = pPVar6;
      *(_func_int ***)((long)pvVar7 + 0x3f0) = elementCount;
      *(uint64_t *)((long)pvVar7 + 0x3f8) = limit_local;
      *(void **)((long)pvVar7 + 0x3c8) = pvVar7;
    }
    else {
      ((local_a0.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)(local_a0.ptr + -4);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_a0,
                 kj::_::
                 SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:188:15)>
                 ::anon_class_32_3_f55ac5fb_for_func::operator());
      OVar4.ptr[-4].super_PromiseArenaMember._vptr_PromiseArenaMember =
           (_func_int **)&PTR_destroy_0070a240;
      OVar4.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)limit;
      OVar4.ptr[-2].super_PromiseArenaMember.arena = pPVar6;
      OVar4.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = elementCount;
      OVar4.ptr[-1].super_PromiseArenaMember.arena = (PromiseArena *)limit_local;
      OVar4.ptr[-4].super_PromiseArenaMember.arena = pPVar3;
    }
    _kjCondition.left = &DAT_005053bd;
    _kjCondition._8_8_ = &DAT_0050541c;
    _kjCondition.op.content.ptr = (char *)0x4c0000058b;
    intermediate.ptr = &this_00->super_PromiseNode;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_38,&intermediate,(SourceLocation *)&_kjCondition);
    OVar4.ptr = intermediate.ptr;
    this->input = local_38;
    if (intermediate.ptr != (PromiseNode *)0x0) {
      intermediate.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar4.ptr)->super_PromiseArenaMember);
    }
    OVar4.ptr = local_a0.ptr;
    if (&(local_a0.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_a0.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar4.ptr)->super_PromiseArenaMember);
    }
    sVar8 = part.size_;
    puVar5 = part.ptr;
    if (part.ptr != (uchar *)0x0) {
      part.ptr = (uchar *)0x0;
      part.size_ = 0;
      (**(part.disposer)->_vptr_ArrayDisposer)(part.disposer,puVar5,1,sVar8,sVar8,0);
    }
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[26]>
            ((Fault *)&part,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0xb6,FAILED,"limit > 0","_kjCondition,\"Reached limit before EOF.\"",&_kjCondition,
             (char (*) [26])"Reached limit before EOF.");
  kj::_::Debug::Fault::fatal((Fault *)&part);
}

Assistant:

Promise<uint64_t> loop(uint64_t limit) {
    KJ_REQUIRE(limit > 0, "Reached limit before EOF.");

    auto part = heapArray<byte>(kj::min(4096, limit));
    auto partPtr = part.asPtr();
    parts.add(kj::mv(part));
    return input.tryRead(partPtr.begin(), partPtr.size(), partPtr.size())
        .then([this,KJ_CPCAP(partPtr),limit](size_t amount) mutable -> Promise<uint64_t> {
      limit -= amount;
      if (amount < partPtr.size()) {
        return limit;
      } else {
        return loop(limit);
      }
    });
  }